

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-create.cc
# Opt level: O0

void __thiscall ImageProvider::~ImageProvider(ImageProvider *this)

{
  ImageProvider *this_local;
  
  ~ImageProvider(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

~ImageProvider() override = default;